

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O1

xml_output * attrTagT(xml_output *__return_storage_ptr__,char *name,triState v)

{
  char *pcVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  storage_type *psVar5;
  char *pcVar6;
  storage_type *psVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QArrayData *local_50;
  char16_t *local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (v == unset) {
    __return_storage_ptr__->xo_type = tNothing;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001f7607;
    (__return_storage_ptr__->xo_value).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->xo_value).d.size = 0;
    (__return_storage_ptr__->xo_text).d.size = 0;
    (__return_storage_ptr__->xo_value).d.d = (Data *)0x0;
    (__return_storage_ptr__->xo_text).d.d = (Data *)0x0;
    (__return_storage_ptr__->xo_text).d.ptr = (char16_t *)0x0;
  }
  else {
    if (name == (char *)0x0) {
      psVar7 = (storage_type *)0x0;
    }
    else {
      psVar5 = (storage_type *)0xffffffffffffffff;
      do {
        psVar7 = psVar5 + 1;
        pcVar6 = name + 1 + (long)psVar5;
        psVar5 = psVar7;
      } while (*pcVar6 != '\0');
    }
    QVar8.m_data = psVar7;
    QVar8.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar8);
    qVar4 = local_40;
    pcVar3 = local_48;
    pQVar2 = local_50;
    pcVar6 = "false";
    if (v == _True) {
      pcVar6 = "true";
    }
    psVar7 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar7 + (long)(pcVar6 + 1);
      psVar7 = psVar7 + 1;
    } while (*pcVar1 != '\0');
    QVar9.m_data = psVar7;
    QVar9.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar9);
    __return_storage_ptr__->xo_type = tTagValue;
    (__return_storage_ptr__->xo_text).d.d = (Data *)pQVar2;
    (__return_storage_ptr__->xo_text).d.ptr = pcVar3;
    (__return_storage_ptr__->xo_text).d.size = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (__return_storage_ptr__->xo_value).d.d = (Data *)local_50;
    (__return_storage_ptr__->xo_value).d.ptr = local_48;
    (__return_storage_ptr__->xo_value).d.size = local_40;
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,2,0x10);
      }
    }
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_001f7607:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline XmlOutput::xml_output attrTagT(const char *name, const triState v)
{
    if(v == unset)
        return noxml();
    return tagValue(name, (v == _True ? "true" : "false"));
}